

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_cwd(char *buffer,size_t size)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  
  iVar1 = -0x16;
  if (size != 0 && buffer != (char *)0x0) {
    pcVar2 = getcwd(buffer,size);
    iVar1 = 0;
    if (pcVar2 == (char *)0x0) {
      piVar3 = __errno_location();
      iVar1 = -*piVar3;
    }
  }
  return iVar1;
}

Assistant:

int uv_cwd(char* buffer, size_t size) {
  if (buffer == NULL)
    return -EINVAL;

  if (size == 0)
    return -EINVAL;

  if (getcwd(buffer, size) == NULL)
    return -errno;

  return 0;
}